

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O1

bool __thiscall LEFReader::parseMacro(LEFReader *this)

{
  string *tokstr;
  size_t __n;
  token_t tVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  string name;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  tVar1 = tokenize(this,&local_50);
  this->m_curtok = tVar1;
  if (tVar1 == TOK_IDENT) {
    tokstr = &this->m_tokstr;
    tVar1 = tokenize(this,tokstr);
    this->m_curtok = tVar1;
    if (tVar1 == TOK_EOL) {
      (*this->_vptr_LEFReader[2])(this,&local_50);
      bVar3 = false;
      do {
        tVar1 = tokenize(this,tokstr);
        this->m_curtok = tVar1;
        if (tVar1 == TOK_IDENT) {
          iVar2 = std::__cxx11::string::compare((char *)tokstr);
          if (iVar2 == 0) {
            parsePin(this);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)tokstr);
            if (iVar2 == 0) {
              parseClass(this);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)tokstr);
              if (iVar2 == 0) {
                parseOrigin(this);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)tokstr);
                if (iVar2 == 0) {
                  parseForeign(this);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)tokstr);
                  if (iVar2 == 0) {
                    parseSize(this);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)tokstr);
                    if (iVar2 == 0) {
                      parseSymmetry(this);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)tokstr);
                      if (iVar2 == 0) {
                        parseSite(this);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (bVar3) {
          if (((this->m_curtok == TOK_IDENT) &&
              (__n = (this->m_tokstr)._M_string_length, __n == local_50._M_string_length)) &&
             ((bVar4 = true, __n == 0 ||
              (iVar2 = bcmp((tokstr->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n), iVar2 == 0)))
             ) goto LAB_0012b77c;
        }
        else if ((this->m_curtok == TOK_IDENT) &&
                (iVar2 = std::__cxx11::string::compare((char *)tokstr), iVar2 == 0)) {
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      } while (((byte)this->m_is[*(long *)(*(long *)this->m_is + -0x18) + 0x20] & 2) == 0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Unexpected end of file\n","");
      error(this,&local_70);
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Expected EOL\n","");
      error(this,&local_70);
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Expected a macro name\n","");
    error(this,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar4 = false;
LAB_0012b77c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool LEFReader::parseMacro()
{
    std::string name;
    

    // macro name
    m_curtok = tokenize(name);
    if (m_curtok != TOK_IDENT)
    {
        error("Expected a macro name\n");
        return false;
    }

    //std::cout << "MACRO " << name << "\n"; 

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL\n");
        return false;
    }

    onMacro(name);

    // wait for 'END macroname'
    bool endFound = false;
    while(true)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok == TOK_IDENT)
        {
            if (m_tokstr == "PIN")
            {
                parsePin();
            }
            else if (m_tokstr == "CLASS")
            {
                parseClass();
            }            
            else if (m_tokstr == "ORIGIN")
            {
                parseOrigin();
            }
            else if (m_tokstr == "FOREIGN")
            {
                parseForeign();
            }
            else if (m_tokstr == "SIZE")
            {
                parseSize();
            }
            else if (m_tokstr == "SYMMETRY")
            {
                parseSymmetry();
            }
            else if (m_tokstr == "SITE")
            {
                parseSite();
            }
            //else if (m_tokstr == "LAYER")
            //{
            //    parseLayer();   // TECH LEF layer, not a port LAYER!
            //}  
        }

        if (endFound)
        {
            if ((m_curtok == TOK_IDENT) && (m_tokstr == name))
            {
                //cout << "END " << name << "\n";
                return true;
            }
        }
        else if ((m_curtok == TOK_IDENT) && (m_tokstr == "END"))
        {
            endFound = true;
        }
        else
        {
            endFound = false;
        }

        if (m_is->eof())
        {
            error("Unexpected end of file\n");
            return false;
        }        
    }
}